

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::add_candidate_id
          (parameter_trie *this,parameter_cla_id *param_id,basic_param_ptr *param_candidate,
          bool final)

{
  parameter_cla_id *local_168 [7];
  undefined **local_130;
  iterator local_128;
  iterator local_120;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  conflicting_param local_f8;
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> local_c0;
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> local_88;
  conflicting_param local_50;
  
  if ((this->m_has_final_candidate == false) &&
     ((!final ||
      ((this->m_id_candidates).
       super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_id_candidates).
       super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    this->m_has_final_candidate = final;
    local_168[0] = param_id;
    std::
    vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ::push_back(&this->m_id_candidates,(value_type *)local_168);
    if ((long)(this->m_id_candidates).
              super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_id_candidates).
              super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      shared_ptr<boost::runtime::basic_param>::operator=(&this->m_param_candidate,param_candidate);
    }
    else {
      shared_ptr<boost::runtime::basic_param>::reset(&this->m_param_candidate);
    }
    return;
  }
  local_118._M_p = (pointer)&local_108;
  local_128 = "";
  local_120 = "";
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_130 = &PTR__param_error_001e2b48;
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            (&local_f8,
             (specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> *)
             &local_130,"Parameter cla id ");
  specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::operator<<
            ((conflicting_param *)&local_c0,
             (specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error> *)
             &local_f8,&param_id->m_tag);
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            ((conflicting_param *)&local_88,&local_c0," conflicts with the ");
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            (&local_50,&local_88,"parameter cla id ");
  specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::operator<<
            ((conflicting_param *)local_168,
             (specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error> *)
             &local_50,
             &((this->m_id_candidates).
               super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].t_)->m_tag);
  unit_test::ut_detail::throw_exception<boost::runtime::conflicting_param>
            ((conflicting_param *)local_168);
}

Assistant:

void                add_candidate_id( parameter_cla_id const& param_id, basic_param_ptr param_candidate, bool final )
    {
        BOOST_TEST_I_ASSRT( !m_has_final_candidate && (!final || m_id_candidates.empty()),
          conflicting_param() << "Parameter cla id " << param_id.m_tag << " conflicts with the "
                              << "parameter cla id " << m_id_candidates.back().get().m_tag );

        m_has_final_candidate = final;
        m_id_candidates.push_back( ref(param_id) );

        if( m_id_candidates.size() == 1 )
            m_param_candidate = param_candidate;
        else
            m_param_candidate.reset();
    }